

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O3

void summaryindex::indexevents
               (string *binfilename,string *idxfilename,
               map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summaryfileperiod_to_offset,int file_id,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *eventtoperiods)

{
  iterator __position;
  pointer pcVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  vector<long_long,std::allocator<long_long>> *this;
  DIR *__dirp;
  dirent *pdVar6;
  size_t sVar7;
  _Rb_tree_node_base *p_Var8;
  undefined8 extraout_RAX;
  _Base_ptr p_Var9;
  ulong uVar10;
  string *__s;
  pointer pbVar11;
  _Rb_tree_color _Var12;
  key_type *unaff_RBP;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmVar13;
  string *psVar14;
  FILE *unaff_R13;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summaryfileperiod_to_offset_00;
  longlong offset;
  summary_period k;
  summarySampleslevelHeader sh;
  char line [4096];
  string sStack_1160;
  value_type vStack_1140;
  string *psStack_1120;
  string sStack_1118;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_10f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_10f0;
  undefined1 auStack_10d8 [32];
  _Rb_tree_node_base *p_Stack_10b8;
  size_t sStack_10b0;
  string *psStack_10a8;
  _Base_ptr p_Stack_10a0;
  FILE *pFStack_1098;
  string *psStack_1090;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *pmStack_1088;
  key_type *pkStack_1080;
  FILE *local_1078;
  long local_1070;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_1068;
  _Base_ptr local_1060;
  string *local_1058;
  key_type local_1050;
  int local_1044 [3];
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1038 [85];
  
  __s = (string *)(ulong)(uint)file_id;
  pmVar13 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)0x10a3ac;
  pkStack_1080 = (key_type *)0x1087c9;
  local_1068 = eventtoperiods;
  local_1078 = fopen((idxfilename->_M_dataplus)._M_p,"r");
  pFVar3 = unaff_R13;
  if (local_1078 == (FILE *)0x0) {
LAB_00108951:
    pkStack_1080 = (key_type *)0x108959;
    indexevents((summaryindex *)idxfilename);
    unaff_R13 = pFVar3;
  }
  else {
    pmVar13 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)0x10a3ac;
    pkStack_1080 = (key_type *)0x1087ea;
    local_1058 = idxfilename;
    pFVar3 = fopen((binfilename->_M_dataplus)._M_p,"r");
    if (pFVar3 != (FILE *)0x0) {
      pkStack_1080 = (key_type *)0x10880d;
      local_1050.fileindex = file_id;
      pcVar4 = fgets((char *)local_1038,0x1000,local_1078);
      if (pcVar4 != (char *)0x0) {
        local_1060 = &(local_1068->_M_t)._M_impl.super__Rb_tree_header._M_header;
        __s = (string *)local_1038;
        unaff_RBP = &local_1050;
        do {
          pkStack_1080 = (key_type *)0x10884a;
          iVar2 = __isoc99_sscanf(__s,"%d,%lld",unaff_RBP,&local_1070);
          if (iVar2 != 2) {
            pmVar13 = local_1038;
            pkStack_1080 = (key_type *)0x108951;
            indexevents();
            binfilename = __s;
            goto LAB_00108951;
          }
          pkStack_1080 = (key_type *)0x108862;
          fseek(pFVar3,local_1070,0);
          pkStack_1080 = (key_type *)0x108879;
          fread(local_1044,0xc,1,pFVar3);
          p_Var9 = (local_1068->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var5 = local_1060;
          if (p_Var9 != (_Base_ptr)0x0) {
            do {
              if (local_1044[0] <= (int)p_Var9[1]._M_color) {
                p_Var5 = p_Var9;
              }
              p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_1044[0]];
            } while (p_Var9 != (_Base_ptr)0x0);
            if ((p_Var5 != local_1060) && ((int)p_Var5[1]._M_color <= local_1044[0])) {
              idxfilename = (string *)p_Var5[1]._M_left;
              for (p_Var9 = p_Var5[1]._M_parent; p_Var9 != (_Base_ptr)idxfilename;
                  p_Var9 = (_Base_ptr)&p_Var9->field_0x4) {
                local_1050.period_no = *(int *)&((_Alloc_hider *)&p_Var9->_M_color)->_M_p;
                pkStack_1080 = (key_type *)0x1088f0;
                this = (vector<long_long,std::allocator<long_long>> *)
                       std::
                       map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ::operator[](summaryfileperiod_to_offset,unaff_RBP);
                __position._M_current = *(longlong **)(this + 8);
                if (__position._M_current == *(longlong **)(this + 0x10)) {
                  pkStack_1080 = (key_type *)0x108919;
                  std::vector<long_long,std::allocator<long_long>>::
                  _M_realloc_insert<long_long_const&>(this,__position,&local_1070);
                }
                else {
                  *__position._M_current = local_1070;
                  *(longlong **)(this + 8) = __position._M_current + 1;
                }
              }
            }
          }
          pkStack_1080 = (key_type *)0x1088c7;
          pcVar4 = fgets((char *)__s,0x1000,local_1078);
        } while (pcVar4 != (char *)0x0);
      }
      pkStack_1080 = (key_type *)0x108928;
      fclose(local_1078);
      pkStack_1080 = (key_type *)0x108930;
      fclose(pFVar3);
      return;
    }
  }
  pkStack_1080 = (key_type *)doit;
  psVar14 = binfilename;
  indexevents((summaryindex *)binfilename);
  vStack_10f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_10f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  summaryfileperiod_to_offset_00 =
       (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        *)0x0;
  vStack_10f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_10d8._24_8_ = auStack_10d8 + 8;
  auStack_10d8._8_4_ = _S_red;
  auStack_10d8._16_8_ = (_Base_ptr)0x0;
  sStack_10b0 = 0;
  psStack_1120 = psVar14;
  pmStack_10f8 = pmVar13;
  p_Stack_10b8 = (_Rb_tree_node_base *)auStack_10d8._24_8_;
  psStack_10a8 = __s;
  p_Stack_10a0 = (_Base_ptr)idxfilename;
  pFStack_1098 = unaff_R13;
  psStack_1090 = binfilename;
  pmStack_1088 = summaryfileperiod_to_offset;
  pkStack_1080 = unaff_RBP;
  __dirp = opendir((psVar14->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
LAB_00108dba:
    doit((summaryindex *)psStack_1120);
LAB_00108dc4:
    doit((summaryindex *)&vStack_1140);
  }
  else {
    while (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0) {
      vStack_1140._M_dataplus._M_p = (pointer)&vStack_1140.field_2;
      sVar7 = strlen(pdVar6->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&vStack_1140,pdVar6->d_name,pdVar6->d_name + sVar7);
      if (4 < vStack_1140._M_string_length) {
        std::__cxx11::string::substr((ulong)&sStack_1160,(ulong)&vStack_1140);
        iVar2 = std::__cxx11::string::compare((char *)&sStack_1160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_1160._M_dataplus._M_p != &sStack_1160.field_2) {
          operator_delete(sStack_1160._M_dataplus._M_p);
        }
        if (iVar2 == 0) {
          sStack_1160._M_dataplus._M_p = (pointer)&sStack_1160.field_2;
          pcVar1 = (psStack_1120->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sStack_1160,pcVar1,pcVar1 + psStack_1120->_M_string_length);
          std::__cxx11::string::append((char *)&sStack_1160);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&vStack_10f0,&vStack_1140);
          sStack_1118._M_dataplus._M_p = (pointer)&sStack_1118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sStack_1118,sStack_1160._M_dataplus._M_p,
                     sStack_1160._M_dataplus._M_p + sStack_1160._M_string_length);
          uVar10 = sStack_1160._M_string_length - 4;
          if (sStack_1118._M_string_length < uVar10) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase");
            goto LAB_00108dba;
          }
          sStack_1118._M_dataplus._M_p[uVar10] = '\0';
          sStack_1118._M_string_length = uVar10;
          std::__cxx11::string::append((char *)&sStack_1118);
          pFVar3 = fopen(sStack_1118._M_dataplus._M_p,"r");
          if (pFVar3 == (FILE *)0x0) {
            indexevents((summaryindex *)&sStack_1160,(string *)auStack_10d8,
                        summaryfileperiod_to_offset_00,(int)pmStack_10f8,eventtoperiods);
          }
          else {
            fclose(pFVar3);
            eventtoperiods = pmStack_10f8;
            indexevents(&sStack_1160,&sStack_1118,
                        (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                         *)auStack_10d8,(int)summaryfileperiod_to_offset_00,pmStack_10f8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_1118._M_dataplus._M_p != &sStack_1118.field_2) {
            operator_delete(sStack_1118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_1160._M_dataplus._M_p != &sStack_1160.field_2) {
            operator_delete(sStack_1160._M_dataplus._M_p);
          }
          summaryfileperiod_to_offset_00 =
               (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                *)(ulong)((int)summaryfileperiod_to_offset_00 + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vStack_1140._M_dataplus._M_p != &vStack_1140.field_2) {
        operator_delete(vStack_1140._M_dataplus._M_p);
      }
    }
    vStack_1140._M_dataplus._M_p = (pointer)&vStack_1140.field_2;
    pcVar1 = (psStack_1120->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vStack_1140,pcVar1,pcVar1 + psStack_1120->_M_string_length);
    std::__cxx11::string::append((char *)&vStack_1140);
    pFVar3 = fopen(vStack_1140._M_dataplus._M_p,"wb");
    if (pFVar3 == (FILE *)0x0) goto LAB_00108dc4;
    pbVar11 = vStack_10f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (vStack_10f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        vStack_10f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fprintf(pFVar3,"%s\n",(pbVar11->_M_dataplus)._M_p);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 !=
               vStack_10f0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fclose(pFVar3);
    sStack_1160._M_dataplus._M_p = (pointer)&sStack_1160.field_2;
    pcVar1 = (psStack_1120->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1160,pcVar1,pcVar1 + psStack_1120->_M_string_length);
    std::__cxx11::string::append((char *)&sStack_1160);
    std::__cxx11::string::operator=((string *)&vStack_1140,(string *)&sStack_1160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1160._M_dataplus._M_p != &sStack_1160.field_2) {
      operator_delete(sStack_1160._M_dataplus._M_p);
    }
    pFVar3 = fopen(vStack_1140._M_dataplus._M_p,"wb");
    if (pFVar3 != (FILE *)0x0) {
      if ((_Rb_tree_node_base *)auStack_10d8._24_8_ == (_Rb_tree_node_base *)(auStack_10d8 + 8)) {
        _Var12 = _S_red;
      }
      else {
        _Var12 = _S_red;
        p_Var8 = (_Rb_tree_node_base *)auStack_10d8._24_8_;
        do {
          if ((int)_Var12 < (int)p_Var8[1]._M_color) {
            _Var12 = p_Var8[1]._M_color;
          }
          for (p_Var9 = p_Var8[1]._M_left; p_Var9 != p_Var8[1]._M_right;
              p_Var9 = (_Base_ptr)&p_Var9->_M_parent) {
            fprintf(pFVar3,"%d, %d, %d, %lld\n",(ulong)p_Var8[1]._M_color,
                    (ulong)*(uint *)&p_Var8[1].field_0x4,(ulong)*(uint *)&p_Var8[1]._M_parent,
                    *(undefined8 *)p_Var9);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != (_Rb_tree_node_base *)(auStack_10d8 + 8));
      }
      fclose(pFVar3);
      sStack_1160._M_dataplus._M_p = (pointer)&sStack_1160.field_2;
      pcVar1 = (psStack_1120->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_1160,pcVar1,pcVar1 + psStack_1120->_M_string_length);
      std::__cxx11::string::append((char *)&sStack_1160);
      std::__cxx11::string::operator=((string *)&vStack_1140,(string *)&sStack_1160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1160._M_dataplus._M_p != &sStack_1160.field_2) {
        operator_delete(sStack_1160._M_dataplus._M_p);
      }
      pFVar3 = fopen(vStack_1140._M_dataplus._M_p,"wb");
      if (pFVar3 != (FILE *)0x0) {
        fprintf(pFVar3,"%d",(ulong)_Var12);
        fclose(pFVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vStack_1140._M_dataplus._M_p != &vStack_1140.field_2) {
          operator_delete(vStack_1140._M_dataplus._M_p);
        }
        std::
        _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)auStack_10d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_10f0);
        return;
      }
      goto LAB_00108dd8;
    }
  }
  doit((summaryindex *)&vStack_1140);
LAB_00108dd8:
  doit((summaryindex *)&vStack_1140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1160._M_dataplus._M_p != &sStack_1160.field_2) {
    operator_delete(sStack_1160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_1140._M_dataplus._M_p != &vStack_1140.field_2) {
    operator_delete(vStack_1140._M_dataplus._M_p);
  }
  std::
  _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)auStack_10d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_10f0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void indexevents(const std::string &binfilename, std::string &idxfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {

		FILE * fidx = fopen(idxfilename.c_str(), "r");
		if (fidx == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", idxfilename.c_str());
			exit(EXIT_FAILURE);
		}
		FILE * fbin = fopen(binfilename.c_str(), "r");
		if (fbin == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", binfilename.c_str());
			exit(EXIT_FAILURE);
		}

		char line[4096];
		summary_period k;
		k.fileindex = file_id;
		while (fgets(line, sizeof(line), fidx) != 0) {
			long long offset;
			int ret = sscanf(line, "%d,%lld", &k.summary_id, &offset);
			if (ret != 2) {
				fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", idxfilename.c_str(), line);
				exit(EXIT_FAILURE);
			}
			// Get period numbers from event IDs
			flseek(fbin, offset, SEEK_SET);
			summarySampleslevelHeader sh;
			fread(&sh, sizeof(sh), 1, fbin);
			std::map<int, std::vector<int>>::const_iterator iter = eventtoperiods.find(sh.event_id);
			if (iter == eventtoperiods.end()) continue;   // Event not found so don't process it
			for (auto period : iter->second) {
				k.period_no = period;
				summaryfileperiod_to_offset[k].push_back(offset);
			}
		}

		fclose(fidx);
		fclose(fbin);

	}